

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O0

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<std::vector<wasm::(anonymous_namespace)::
GlobalStructInference::run(wasm::Module*)::GlobalToUnnest,std::allocator<wasm::(anonymous_namespace)
::GlobalStructInference::run(wasm::Module*)::GlobalToUnnest>>,(wasm::Mutability)0,wasm::ModuleUtils
::DefaultMap>::doAnalysis(std::function<void(wasm::Function*,std::vector<wasm::(anonymous_namespace)
::GlobalStructInference::run(wasm::Module*)::GlobalToUnnest,std::allocator<wasm::
(anonymous_namespace)::GlobalStructInference::run(wasm::Module*)::GlobalToUnnest>>&)>)::Mapper::
doWalkFunction(wasm::Function__(void *this,Function *curr)

{
  Function *__args;
  size_type sVar1;
  mapped_type *__args_1;
  Function *local_18;
  Function *curr_local;
  Mapper *this_local;
  
  local_18 = curr;
  curr_local = (Function *)this;
  sVar1 = std::
          map<wasm::Function_*,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>_>
          ::count(*(map<wasm::Function_*,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>_>
                    **)((long)this + 0x138),&local_18);
  __args = local_18;
  if (sVar1 != 0) {
    __args_1 = std::
               map<wasm::Function_*,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>_>
               ::operator[](*(map<wasm::Function_*,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_>_>_>
                              **)((long)this + 0x138),&local_18);
    std::
    function<void_(wasm::Function_*,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_&)>
    ::operator()((function<void_(wasm::Function_*,_std::vector<GlobalToUnnest,_std::allocator<GlobalToUnnest>_>_&)>
                  *)((long)this + 0x140),__args,__args_1);
    return;
  }
  __assert_fail("map.count(curr)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h"
                ,0x13e,
                "void wasm::ModuleUtils::ParallelFunctionAnalysis<std::vector<GlobalToUnnest>>::doAnalysis(Func)::Mapper::doWalkFunction(Function *) [T = std::vector<GlobalToUnnest>, Mut = wasm::Immutable, MapT = wasm::ModuleUtils::DefaultMap]"
               );
}

Assistant:

void doWalkFunction(Function* curr) {
        assert(map.count(curr));
        work(curr, map[curr]);
      }